

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_frame_codec.c
# Opt level: O0

void amqp_value_decoded(void *context,AMQP_VALUE decoded_value)

{
  _Bool _Var1;
  AMQP_VALUE descriptor_00;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  AMQP_VALUE descriptor;
  SASL_FRAME_CODEC_INSTANCE *sasl_frame_codec_instance;
  AMQP_VALUE decoded_value_local;
  void *context_local;
  
  descriptor_00 = amqpvalue_get_inplace_descriptor(decoded_value);
  if (descriptor_00 == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                ,"amqp_value_decoded",0x32,1,"Cannot get frame descriptor");
    }
    *(undefined4 *)((long)context + 0x28) = 1;
    (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18));
  }
  else {
    _Var1 = is_sasl_mechanisms_type_by_descriptor(descriptor_00);
    if ((((_Var1) || (_Var1 = is_sasl_init_type_by_descriptor(descriptor_00), _Var1)) ||
        (_Var1 = is_sasl_challenge_type_by_descriptor(descriptor_00), _Var1)) ||
       ((_Var1 = is_sasl_response_type_by_descriptor(descriptor_00), _Var1 ||
        (_Var1 = is_sasl_outcome_type_by_descriptor(descriptor_00), _Var1)))) {
      *(AMQP_VALUE *)((long)context + 0x30) = decoded_value;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                  ,"amqp_value_decoded",0x41,1,"Not a SASL frame");
      }
      *(undefined4 *)((long)context + 0x28) = 1;
      (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18));
    }
  }
  return;
}

Assistant:

static void amqp_value_decoded(void* context, AMQP_VALUE decoded_value)
{
    AMQP_FRAME_CODEC_HANDLE amqp_frame_codec = (AMQP_FRAME_CODEC_HANDLE)context;
    uint64_t performative_descriptor_ulong;
    AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(decoded_value);

    /* Codes_SRS_AMQP_FRAME_CODEC_01_060: [If any error occurs while decoding a frame, the decoder shall switch to an error state where decoding shall not be possible anymore.] */
    if ((descriptor == NULL) ||
        (amqpvalue_get_ulong(descriptor, &performative_descriptor_ulong) != 0) ||
        /* Codes_SRS_AMQP_FRAME_CODEC_01_003: [The performative MUST be one of those defined in section 2.7 and is encoded as a described type in the AMQP type system.] */
        (performative_descriptor_ulong < AMQP_OPEN) ||
        (performative_descriptor_ulong > AMQP_CLOSE))
    {
        /* Codes_SRS_AMQP_FRAME_CODEC_01_060: [If any error occurs while decoding a frame, the decoder shall switch to an error state where decoding shall not be possible anymore.] */
        amqp_frame_codec->decode_state = AMQP_FRAME_DECODE_ERROR;
    }
    else
    {
        amqp_frame_codec->decoded_performative = decoded_value;
    }
}